

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QCommandLineOption>::emplace<QCommandLineOption_const&>
          (QMovableArrayOps<QCommandLineOption> *this,qsizetype i,QCommandLineOption *args)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QCommandLineOption *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QCommandLineOption tmp;
  QCommandLineOption *in_stack_ffffffffffffff78;
  Inserter *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff9c;
  QArrayDataPointer<QCommandLineOption> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QArrayDataPointer<QCommandLineOption>::needsDetach
                    ((QArrayDataPointer<QCommandLineOption> *)in_stack_ffffffffffffff80);
  if (!bVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QCommandLineOption>::freeSpaceAtEnd
                          ((QArrayDataPointer<QCommandLineOption> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QCommandLineOption>::end
                ((QArrayDataPointer<QCommandLineOption> *)in_stack_ffffffffffffff80);
      QCommandLineOption::QCommandLineOption
                ((QCommandLineOption *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceTo = (QCommandLineOption *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_006f8ba3;
    }
    if ((in_RSI == (QCommandLineOption *)0x0) &&
       (qVar3 = QArrayDataPointer<QCommandLineOption>::freeSpaceAtBegin
                          ((QArrayDataPointer<QCommandLineOption> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar3 != 0)) {
      QArrayDataPointer<QCommandLineOption>::begin
                ((QArrayDataPointer<QCommandLineOption> *)0x6f8a4a);
      QCommandLineOption::QCommandLineOption
                ((QCommandLineOption *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QCommandLineOption *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_006f8ba3;
    }
  }
  QCommandLineOption::QCommandLineOption
            ((QCommandLineOption *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = in_RDI->displaceTo != (QCommandLineOption *)0x0;
  uVar4 = bVar2 && in_RSI == (QCommandLineOption *)0x0;
  QArrayDataPointer<QCommandLineOption>::detachAndGrow
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(qsizetype)in_RDI,
             (QCommandLineOption **)CONCAT17(uVar4,in_stack_ffffffffffffff88),
             (QArrayDataPointer<QCommandLineOption> *)in_stack_ffffffffffffff80);
  if (bVar2 && in_RSI == (QCommandLineOption *)0x0) {
    QArrayDataPointer<QCommandLineOption>::begin((QArrayDataPointer<QCommandLineOption> *)0x6f8afd);
    QCommandLineOption::QCommandLineOption
              ((QCommandLineOption *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QCommandLineOption *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  else {
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QCommandLineOption> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff88),
                       (qsizetype)in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Inserter::~Inserter(in_RDI);
  }
  QCommandLineOption::~QCommandLineOption((QCommandLineOption *)0x6f8ba3);
LAB_006f8ba3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }